

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferViewVkImpl.cpp
# Opt level: O1

void __thiscall
Diligent::BufferViewVkImpl::BufferViewVkImpl
          (BufferViewVkImpl *this,IReferenceCounters *pRefCounters,RenderDeviceVkImpl *pDevice,
          BufferViewDesc *ViewDesc,IBuffer *pBuffer,BufferViewWrapper *BuffView,bool bIsDefaultView)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  BufferViewBase<Diligent::EngineVkImplTraits>::BufferViewBase
            (&this->super_BufferViewBase<Diligent::EngineVkImplTraits>,pRefCounters,pDevice,ViewDesc
             ,pBuffer,bIsDefaultView,false);
  (this->super_BufferViewBase<Diligent::EngineVkImplTraits>).
  super_DeviceObjectBase<Diligent::IBufferViewVk,_Diligent::RenderDeviceVkImpl,_Diligent::BufferViewDesc>
  .super_ObjectBase<Diligent::IBufferViewVk>.super_RefCountedObject<Diligent::IBufferViewVk>.
  super_IBufferViewVk.super_IBufferView.super_IDeviceObject =
       (IDeviceObject)&PTR_QueryInterface_00b02110;
  (this->m_BuffView).m_pLogicalDevice.
  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (BuffView->m_pLogicalDevice).
         super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
  (this->m_BuffView).m_pLogicalDevice.
  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (BuffView->m_pLogicalDevice).
           super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
  (BuffView->m_pLogicalDevice).
  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->m_BuffView).m_pLogicalDevice.
  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  (BuffView->m_pLogicalDevice).
  super___shared_ptr<const_VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->m_BuffView).m_VkObject = BuffView->m_VkObject;
  BuffView->m_VkObject = (VkBufferView_T *)0x0;
  return;
}

Assistant:

BufferViewVkImpl::BufferViewVkImpl(IReferenceCounters*                  pRefCounters,
                                   RenderDeviceVkImpl*                  pDevice,
                                   const BufferViewDesc&                ViewDesc,
                                   IBuffer*                             pBuffer,
                                   VulkanUtilities::BufferViewWrapper&& BuffView,
                                   bool                                 bIsDefaultView) :
    // clang-format off
    TBufferViewBase
    {
        pRefCounters,
        pDevice,
        ViewDesc,
        pBuffer,
        bIsDefaultView
    },
    m_BuffView{std::move(BuffView)}
// clang-format on
{
}